

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.h
# Opt level: O0

string * __thiscall
wabt::operator+[abi_cxx11_(string *__return_storage_ptr__,wabt *this,char *x,string_view y)

{
  size_type in_R9;
  string_view x_00;
  string_view y_00;
  string_view local_38;
  wabt *local_28;
  char *x_local;
  string_view y_local;
  
  y_local.data_ = y.data_;
  local_28 = this;
  x_local = x;
  y_local.size_ = (size_type)__return_storage_ptr__;
  string_view::string_view(&local_38,(char *)this);
  x_00.size_ = (size_type)x_local;
  x_00.data_ = (char *)local_38.size_;
  y_00.size_ = in_R9;
  y_00.data_ = y_local.data_;
  operator+[abi_cxx11_(__return_storage_ptr__,(wabt *)local_38.data_,x_00,y_00);
  return __return_storage_ptr__;
}

Assistant:

inline std::string operator+(const char* x, string_view y) {
  return string_view(x) + y;
}